

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O2

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::CoreApp::generateParser(CoreApp *this)

{
  App *this_00;
  long in_RSI;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::make_unique<helics::helicsCLI11App,char_const(&)[19]>((char (*) [19])this);
  helicsCLI11App::addTypeOption
            ((helicsCLI11App *)
             (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
  if (*(long *)(in_RSI + 0x18) == 0) {
    this_00 = (App *)(this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"--name,-n",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"name of the core",&local_7a);
    CLI::App::
    add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
              (this_00,&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x10),
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  local_38._M_unused._M_object =
       (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined1 *)&((element_type *)((long)local_38._M_unused._0_8_ + 0x48))->_vptr_Core = 1;
  local_38._8_8_ = 0;
  local_20 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/CoreApp.cpp:105:17)>
             ::_M_invoke;
  local_28 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/CoreApp.cpp:105:17)>
             ::_M_manager;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)((long)local_38._M_unused._0_8_ + 0x150),
            (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)&local_38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<helicsCLI11App> CoreApp::generateParser()
{
    auto app = std::make_unique<helicsCLI11App>("Broker application");
    app->addTypeOption();
    if (name.empty()) {
        app->add_option("--name,-n", name, "name of the core");
    }
    app->allow_extras();
    auto* app_p = app.get();
    app->footer([app_p]() {
        auto coreType = helics::core::coreTypeFromString((*app_p)["--coretype"]->as<std::string>());
        CoreFactory::displayHelp(coreType);
        return std::string{};
    });
    return app;
}